

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionDispatcher.cpp
# Opt level: O3

cbtPersistentManifold * __thiscall
cbtCollisionDispatcher::getNewManifold
          (cbtCollisionDispatcher *this,cbtCollisionObject *body0,cbtCollisionObject *body1)

{
  undefined8 *puVar1;
  cbtPersistentManifold **ptr;
  undefined1 auVar2 [16];
  uint uVar3;
  cbtScalar *pcVar4;
  cbtPersistentManifold *pcVar5;
  long lVar6;
  cbtPersistentManifold **ppcVar7;
  ulong uVar8;
  int iVar9;
  cbtScalar cVar10;
  cbtScalar cVar11;
  float local_38;
  float local_34;
  
  if ((this->m_dispatcherFlags & 2) == 0) {
    pcVar4 = &gContactBreakingThreshold;
  }
  else {
    cVar10 = gContactBreakingThreshold;
    (*body0->m_collisionShape->_vptr_cbtCollisionShape[5])();
    cVar11 = gContactBreakingThreshold;
    local_34 = cVar10;
    (*body1->m_collisionShape->_vptr_cbtCollisionShape[5])();
    local_38 = cVar11;
    pcVar4 = &local_38;
    if (cVar10 < cVar11) {
      pcVar4 = &local_34;
    }
  }
  cVar10 = *pcVar4;
  auVar2 = vminss_avx(ZEXT416((uint)body0->m_contactProcessingThreshold),
                      ZEXT416((uint)body1->m_contactProcessingThreshold));
  pcVar5 = (cbtPersistentManifold *)
           cbtPoolAllocator::allocate(this->m_persistentManifoldPoolAllocator,0x3b0);
  if (pcVar5 == (cbtPersistentManifold *)0x0) {
    if ((this->m_dispatcherFlags & 4) != 0) {
      return (cbtPersistentManifold *)0x0;
    }
    pcVar5 = (cbtPersistentManifold *)cbtAlignedAllocInternal(0x3b0,0x10);
  }
  lVar6 = 0x98;
  (pcVar5->super_cbtTypedObject).m_objectType = 0x401;
  do {
    puVar1 = (undefined8 *)((long)pcVar5 + lVar6 + -0x90);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)pcVar5 + lVar6 + -0x80) = 0;
    puVar1 = (undefined8 *)((long)pcVar5->m_pointCache[0].reactions_cache + lVar6 + -8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1 = (undefined8 *)((long)pcVar5->m_pointCache[0].reactions_cache + lVar6 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    lVar6 = lVar6 + 0xe0;
  } while (lVar6 != 0x418);
  pcVar5->m_body0 = body0;
  pcVar5->m_body1 = body1;
  pcVar5->m_cachedPoints = 0;
  pcVar5->m_contactBreakingThreshold = cVar10;
  pcVar5->m_contactProcessingThreshold = auVar2._0_4_;
  pcVar5->m_companionIdA = 0;
  pcVar5->m_companionIdB = 0;
  uVar3 = (this->m_manifoldsPtr).m_size;
  pcVar5->m_index1a = uVar3;
  if (uVar3 == (this->m_manifoldsPtr).m_capacity) {
    iVar9 = 1;
    if (uVar3 != 0) {
      iVar9 = uVar3 * 2;
    }
    if ((int)uVar3 < iVar9) {
      if (iVar9 == 0) {
        ppcVar7 = (cbtPersistentManifold **)0x0;
      }
      else {
        ppcVar7 = (cbtPersistentManifold **)cbtAlignedAllocInternal((long)iVar9 << 3,0x10);
        uVar3 = (this->m_manifoldsPtr).m_size;
      }
      if (0 < (int)uVar3) {
        uVar8 = 0;
        do {
          ppcVar7[uVar8] = (this->m_manifoldsPtr).m_data[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar3 != uVar8);
      }
      ptr = (this->m_manifoldsPtr).m_data;
      if ((ptr != (cbtPersistentManifold **)0x0) && ((this->m_manifoldsPtr).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ptr);
        uVar3 = (this->m_manifoldsPtr).m_size;
      }
      (this->m_manifoldsPtr).m_ownsMemory = true;
      (this->m_manifoldsPtr).m_data = ppcVar7;
      (this->m_manifoldsPtr).m_capacity = iVar9;
    }
  }
  (this->m_manifoldsPtr).m_data[(int)uVar3] = pcVar5;
  (this->m_manifoldsPtr).m_size = uVar3 + 1;
  return pcVar5;
}

Assistant:

cbtPersistentManifold* cbtCollisionDispatcher::getNewManifold(const cbtCollisionObject* body0, const cbtCollisionObject* body1)
{
	//cbtAssert(gNumManifold < 65535);

	//optional relative contact breaking threshold, turned on by default (use setDispatcherFlags to switch off feature for improved performance)

	cbtScalar contactBreakingThreshold = (m_dispatcherFlags & cbtCollisionDispatcher::CD_USE_RELATIVE_CONTACT_BREAKING_THRESHOLD) ? cbtMin(body0->getCollisionShape()->getContactBreakingThreshold(gContactBreakingThreshold), body1->getCollisionShape()->getContactBreakingThreshold(gContactBreakingThreshold))
																																: gContactBreakingThreshold;

	cbtScalar contactProcessingThreshold = cbtMin(body0->getContactProcessingThreshold(), body1->getContactProcessingThreshold());

	void* mem = m_persistentManifoldPoolAllocator->allocate(sizeof(cbtPersistentManifold));
	if (NULL == mem)
	{
		//we got a pool memory overflow, by default we fallback to dynamically allocate memory. If we require a contiguous contact pool then assert.
		if ((m_dispatcherFlags & CD_DISABLE_CONTACTPOOL_DYNAMIC_ALLOCATION) == 0)
		{
			mem = cbtAlignedAlloc(sizeof(cbtPersistentManifold), 16);
		}
		else
		{
			cbtAssert(0);
			//make sure to increase the m_defaultMaxPersistentManifoldPoolSize in the cbtDefaultCollisionConstructionInfo/cbtDefaultCollisionConfiguration
			return 0;
		}
	}
	cbtPersistentManifold* manifold = new (mem) cbtPersistentManifold(body0, body1, 0, contactBreakingThreshold, contactProcessingThreshold);
	manifold->m_index1a = m_manifoldsPtr.size();
	m_manifoldsPtr.push_back(manifold);

	return manifold;
}